

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Aig_Man_t * Saig_ManRetimeMinAreaBackward(Aig_Man_t *pNew,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *p;
  Vec_Int_t *vInit;
  void *Entry;
  Aig_Man_t *pAVar3;
  
  pVVar2 = Saig_ManGetRegistersToExclude(pNew);
  if ((fVerbose != 0) && (pVVar2->nSize != 0)) {
    printf("Excluding %d registers that cannot be backward retimed.\n");
  }
  while( true ) {
    Saig_ManHideBadRegs(pNew,pVVar2);
    Vec_PtrFree(pVVar2);
    pVVar2 = Nwk_ManDeriveRetimingCut(pNew,0,fVerbose);
    if (pNew->nRegs <= pVVar2->nSize) {
      Vec_PtrFree(pVVar2);
      return (Aig_Man_t *)0x0;
    }
    p = Saig_ManRetimeDupInitState(pNew,pVVar2);
    vInit = Saig_ManRetimeInitState(p);
    if (vInit != (Vec_Int_t *)0x0) break;
    Vec_PtrFree(pVVar2);
    uVar1 = Saig_ManRetimeUnsatCore(p,fVerbose);
    Aig_ManStop(p);
    if (fVerbose != 0) {
      printf("Excluding register %d.\n",(ulong)uVar1);
    }
    pVVar2 = Vec_PtrAlloc(1);
    Entry = Vec_PtrEntry(pNew->vCos,uVar1 + pNew->nTruePos);
    Vec_PtrPush(pVVar2,Entry);
  }
  pAVar3 = Saig_ManRetimeDupBackward(pNew,pVVar2,vInit);
  Vec_IntFree(vInit);
  Vec_PtrFree(pVVar2);
  Aig_ManStop(p);
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManRetimeMinAreaBackward( Aig_Man_t * pNew, int fVerbose )
{
    Aig_Man_t * pInit, * pFinal;
    Vec_Ptr_t * vBadRegs, * vCut;
    Vec_Int_t * vInit;
    int iBadReg;
    // transform the AIG to have no bad registers
    vBadRegs = Saig_ManGetRegistersToExclude( pNew );
    if ( fVerbose && Vec_PtrSize(vBadRegs) )
        printf( "Excluding %d registers that cannot be backward retimed.\n", Vec_PtrSize(vBadRegs) ); 
    while ( 1 )
    {
        Saig_ManHideBadRegs( pNew, vBadRegs );
        Vec_PtrFree( vBadRegs );
        // compute cut
        vCut = Nwk_ManDeriveRetimingCut( pNew, 0, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            Vec_PtrFree( vCut );
            return NULL;
        }
        // derive the initial state
        pInit = Saig_ManRetimeDupInitState( pNew, vCut );
        vInit = Saig_ManRetimeInitState( pInit );
        if ( vInit != NULL )
        {
            pFinal = Saig_ManRetimeDupBackward( pNew, vCut, vInit );
            Vec_IntFree( vInit );
            Vec_PtrFree( vCut );
            Aig_ManStop( pInit );
            return pFinal;
        }
        Vec_PtrFree( vCut );
        // there is no initial state - find the offending output
        iBadReg = Saig_ManRetimeUnsatCore( pInit, fVerbose );
        Aig_ManStop( pInit );
        if ( fVerbose )
            printf( "Excluding register %d.\n", iBadReg ); 
        // prepare to remove this output
        vBadRegs = Vec_PtrAlloc( 1 );
        Vec_PtrPush( vBadRegs, Aig_ManCo( pNew, Saig_ManPoNum(pNew) + iBadReg ) );
    }
    return NULL;
}